

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

DdNode * Abc_NodeConeBdd(DdManager *dd,DdNode **pbVars,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vVisited)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  DdNode *n;
  int iVar4;
  long lVar5;
  Abc_Obj_t *pRoot_local;
  
  pRoot_local = pRoot;
  Abc_NodeConeCollect(&pRoot_local,1,vLeaves,vVisited,0);
  for (lVar5 = 0; lVar5 < vLeaves->nSize; lVar5 = lVar5 + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,(int)lVar5);
    *(DdNode **)((long)pvVar2 + 0x40) = pbVars[lVar5];
  }
  n = (DdNode *)0x0;
  iVar4 = 0;
  while( true ) {
    if (vVisited->nSize <= iVar4) {
      if (n != (DdNode *)0x0) {
        Cudd_Ref(n);
        for (iVar4 = 0; iVar4 < vVisited->nSize; iVar4 = iVar4 + 1) {
          pvVar2 = Vec_PtrEntry(vVisited,iVar4);
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x40));
        }
        Cudd_Deref(n);
        return n;
      }
      __assert_fail("bFunc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                    ,0x20a,
                    "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    plVar3 = (long *)Vec_PtrEntry(vVisited,iVar4);
    uVar1 = *(uint *)((long)plVar3 + 0x14);
    if ((uVar1 & 0xf) == 2) break;
    lVar5 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
    n = Cudd_bddAnd(dd,(DdNode *)
                       ((ulong)(uVar1 >> 10 & 1) ^
                       *(ulong *)(*(long *)(lVar5 + (long)*(int *)plVar3[4] * 8) + 0x40)),
                    (DdNode *)
                    ((ulong)(uVar1 >> 0xb & 1) ^
                    *(ulong *)(*(long *)(lVar5 + (long)((int *)plVar3[4])[1] * 8) + 0x40)));
    Cudd_Ref(n);
    plVar3[8] = (long)n;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("!Abc_ObjIsPi(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                ,0x204,
                "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

DdNode * Abc_NodeConeBdd( DdManager * dd, DdNode ** pbVars, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    DdNode * bFunc0, * bFunc1, * bFunc = NULL;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVars[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    assert(bFunc);
    Cudd_Ref( bFunc );
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    Cudd_Deref( bFunc );
    return bFunc;
}